

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM_derive.cpp
# Opt level: O0

void pelelm_dermixfrac(Box *bx,FArrayBox *derfab,int dcomp,int ncomp,FArrayBox *datfab,
                      Geometry *param_6,Real param_7,int *param_8,int param_9)

{
  reference pvVar1;
  long in_RSI;
  long in_R8;
  int n;
  GpuArray<double,_9U> fact_lcl;
  Real denom_inv;
  Real Zfu_lcl;
  Real Zox_lcl;
  Array4<double> mixt_frac;
  Array4<const_double> rhoY;
  Array4<const_double> density;
  size_type in_stack_fffffffffffff978;
  array<double,_9UL> *in_stack_fffffffffffff980;
  char *in_stack_fffffffffffff990;
  Array4<const_double> *this;
  undefined1 local_668 [48];
  anon_class_280_6_e428303c *in_stack_fffffffffffff9c8;
  Box *in_stack_fffffffffffff9d0;
  undefined1 auStack_628 [64];
  undefined1 auStack_5e8 [64];
  undefined1 auStack_5a8 [72];
  Real local_560;
  double local_558;
  int local_54c;
  value_type_conflict1 local_548 [9];
  double local_500;
  Real local_4f8;
  Real local_4f0;
  Array4<double> local_4e8;
  Array4<const_double> local_4a8;
  Array4<const_double> local_468;
  long local_418;
  long local_408;
  Array4<double> local_3f8;
  int local_3b4;
  long local_3b0;
  Array4<const_double> local_3a8;
  int local_364;
  long local_360;
  Array4<const_double> local_358;
  int local_314;
  long local_310;
  char *local_308;
  int local_2fc;
  value_type_conflict1 *local_2f8;
  Dim3 local_2f0;
  Dim3 local_2e0;
  Dim3 local_2d0;
  Dim3 local_2c0;
  int local_2b4;
  undefined8 *local_2b0;
  double *local_2a8;
  Dim3 local_2a0;
  Dim3 local_290;
  Dim3 local_280;
  Dim3 local_270;
  int local_264;
  undefined8 *local_260;
  double *local_258;
  Dim3 local_250;
  undefined8 *local_240;
  undefined4 local_234;
  undefined4 uStack_230;
  int local_22c;
  Dim3 local_228;
  undefined8 *local_218;
  undefined4 local_20c;
  undefined4 uStack_208;
  int local_204;
  Dim3 local_200;
  undefined8 *local_1f0;
  int local_1e4;
  int iStack_1e0;
  int local_1dc;
  Dim3 local_1d8;
  undefined8 *local_1c8;
  int local_1c0;
  int iStack_1bc;
  int local_1b8;
  undefined4 local_1b4;
  long local_1b0;
  undefined4 local_1a4;
  long local_1a0;
  undefined4 local_194;
  int *local_190;
  undefined4 local_184;
  long local_180;
  undefined4 local_174;
  long local_170;
  undefined4 local_164;
  int *local_160;
  undefined4 local_154;
  undefined8 *local_150;
  undefined4 local_144;
  undefined8 *local_140;
  undefined4 local_134;
  undefined8 *local_130;
  undefined4 local_124;
  undefined8 *local_120;
  undefined4 local_114;
  undefined8 *local_110;
  undefined4 local_104;
  undefined8 *local_100;
  Dim3 local_f8;
  Dim3 local_e4;
  Dim3 local_d8;
  Dim3 local_c8;
  int local_bc;
  undefined8 *local_b8;
  double *local_b0;
  Dim3 local_a8;
  undefined8 *local_98;
  undefined4 local_8c;
  undefined4 uStack_88;
  int local_84;
  Dim3 local_80;
  undefined8 *local_70;
  int local_68;
  int iStack_64;
  int local_60;
  undefined4 local_5c;
  long local_58;
  undefined4 local_4c;
  long local_48;
  undefined4 local_3c;
  int *local_38;
  undefined4 local_2c;
  undefined8 *local_28;
  undefined4 local_1c;
  undefined8 *local_18;
  undefined4 local_c;
  undefined8 *local_8;
  
  local_418 = in_R8;
  local_408 = in_RSI;
  if (!PeleLM::mixture_fraction_ready) {
    local_308 = "Mixture fraction not initialized";
    amrex::Abort_host(in_stack_fffffffffffff990);
  }
  local_310 = local_418;
  local_314 = 0;
  local_2a8 = *(double **)(local_418 + 0x10);
  local_2b0 = (undefined8 *)(local_418 + 0x18);
  local_2b4 = *(int *)(local_418 + 0x34);
  local_134 = 0;
  local_20c = *(undefined4 *)local_2b0;
  local_144 = 1;
  uStack_208 = *(undefined4 *)(local_418 + 0x1c);
  local_2d0._0_8_ = *local_2b0;
  local_154 = 2;
  local_2d0.z = *(int *)(local_418 + 0x20);
  local_190 = (int *)(local_418 + 0x24);
  local_194 = 0;
  local_1c0 = *local_190 + 1;
  local_1a0 = local_418 + 0x24;
  local_1a4 = 1;
  iStack_1bc = *(int *)(local_418 + 0x28) + 1;
  local_1b0 = local_418 + 0x24;
  local_1b4 = 2;
  local_2f0.z = *(int *)(local_418 + 0x2c) + 1;
  local_2f0.y = iStack_1bc;
  local_2f0.x = local_1c0;
  local_2e0._0_8_ = local_2f0._0_8_;
  local_2e0.z = local_2f0.z;
  local_2c0._0_8_ = local_2d0._0_8_;
  local_2c0.z = local_2d0.z;
  local_228._0_8_ = local_2d0._0_8_;
  local_228.z = local_2d0.z;
  local_218 = local_2b0;
  local_204 = local_2d0.z;
  local_1d8._0_8_ = local_2f0._0_8_;
  local_1d8.z = local_2f0.z;
  local_1c8 = local_2b0;
  local_1b8 = local_2f0.z;
  local_150 = local_2b0;
  local_140 = local_2b0;
  local_130 = local_2b0;
  amrex::Array4<const_double>::Array4(&local_358,local_2a8,&local_2c0,&local_2e0,local_2b4);
  amrex::Array4<const_double>::Array4<const_double,_0>(&local_468,&local_358,local_314);
  local_360 = local_418;
  local_364 = 1;
  local_258 = *(double **)(local_418 + 0x10);
  local_260 = (undefined8 *)(local_418 + 0x18);
  local_264 = *(int *)(local_418 + 0x34);
  local_104 = 0;
  local_234 = *(undefined4 *)local_260;
  local_114 = 1;
  uStack_230 = *(undefined4 *)(local_418 + 0x1c);
  local_280._0_8_ = *local_260;
  local_124 = 2;
  local_280.z = *(int *)(local_418 + 0x20);
  local_160 = (int *)(local_418 + 0x24);
  local_164 = 0;
  local_1e4 = *local_160 + 1;
  local_170 = local_418 + 0x24;
  local_174 = 1;
  iStack_1e0 = *(int *)(local_418 + 0x28) + 1;
  local_180 = local_418 + 0x24;
  local_184 = 2;
  local_2a0.z = *(int *)(local_418 + 0x2c) + 1;
  local_2a0.y = iStack_1e0;
  local_2a0.x = local_1e4;
  this = &local_3a8;
  local_290._0_8_ = local_2a0._0_8_;
  local_290.z = local_2a0.z;
  local_270._0_8_ = local_280._0_8_;
  local_270.z = local_280.z;
  local_250._0_8_ = local_280._0_8_;
  local_250.z = local_280.z;
  local_240 = local_260;
  local_22c = local_280.z;
  local_200._0_8_ = local_2a0._0_8_;
  local_200.z = local_2a0.z;
  local_1f0 = local_260;
  local_1dc = local_2a0.z;
  local_120 = local_260;
  local_110 = local_260;
  local_100 = local_260;
  amrex::Array4<const_double>::Array4(this,local_258,&local_270,&local_290,local_264);
  amrex::Array4<const_double>::Array4<const_double,_0>(&local_4a8,this,local_364);
  local_3b0 = local_408;
  local_3b4 = 0;
  local_b0 = *(double **)(local_408 + 0x10);
  local_b8 = (undefined8 *)(local_408 + 0x18);
  local_bc = *(int *)(local_408 + 0x34);
  local_c = 0;
  local_8c = *(undefined4 *)local_b8;
  local_1c = 1;
  uStack_88 = *(undefined4 *)(local_408 + 0x1c);
  local_d8._0_8_ = *local_b8;
  local_2c = 2;
  local_d8.z = *(int *)(local_408 + 0x20);
  local_38 = (int *)(local_408 + 0x24);
  local_3c = 0;
  local_68 = *local_38 + 1;
  local_48 = local_408 + 0x24;
  local_4c = 1;
  iStack_64 = *(int *)(local_408 + 0x28) + 1;
  local_58 = local_408 + 0x24;
  local_5c = 2;
  local_f8.z = *(int *)(local_408 + 0x2c) + 1;
  local_f8.y = iStack_64;
  local_f8.x = local_68;
  local_e4._0_8_ = local_f8._0_8_;
  local_e4.z = local_f8.z;
  local_c8._0_8_ = local_d8._0_8_;
  local_c8.z = local_d8.z;
  local_a8._0_8_ = local_d8._0_8_;
  local_a8.z = local_d8.z;
  local_98 = local_b8;
  local_84 = local_d8.z;
  local_80._0_8_ = local_f8._0_8_;
  local_80.z = local_f8.z;
  local_70 = local_b8;
  local_60 = local_f8.z;
  local_28 = local_b8;
  local_18 = local_b8;
  local_8 = local_b8;
  amrex::Array4<double>::Array4(&local_3f8,local_b0,&local_c8,&local_e4,local_bc);
  amrex::Array4<double>::Array4<double,_0>(&local_4e8,&local_3f8,local_3b4);
  local_4f0 = PeleLM::Zox;
  local_4f8 = PeleLM::Zfu;
  local_500 = 1.0 / (PeleLM::Zfu - PeleLM::Zox);
  for (local_54c = 0; local_54c < 9; local_54c = local_54c + 1) {
    pvVar1 = std::array<double,_9UL>::operator[]
                       (in_stack_fffffffffffff980,in_stack_fffffffffffff978);
    local_2fc = local_54c;
    local_2f8 = local_548;
    local_2f8[local_54c] = *pvVar1;
  }
  memcpy(local_668,&local_468,0x3c);
  memcpy(auStack_628,&local_4a8,0x3c);
  memcpy(auStack_5e8,&local_4e8,0x3c);
  memcpy(auStack_5a8,local_548,0x48);
  local_560 = local_4f0;
  local_558 = local_500;
  amrex::
  ParallelFor<pelelm_dermixfrac(amrex::Box_const&,amrex::FArrayBox&,int,int,amrex::FArrayBox_const&,amrex::Geometry_const&,double,int_const*,int)::__0>
            (in_stack_fffffffffffff9d0,in_stack_fffffffffffff9c8);
  return;
}

Assistant:

void pelelm_dermixfrac (const Box& bx, FArrayBox& derfab, int dcomp, int ncomp,
                  const FArrayBox& datfab, const Geometry& /*geomdata*/,
                  Real /*time*/, const int* /*bcrec*/, int /*level*/)

{
    AMREX_ASSERT(derfab.box().contains(bx));
    AMREX_ASSERT(datfab.box().contains(bx));
    AMREX_ASSERT(derfab.nComp() >= dcomp + ncomp);
    AMREX_ASSERT(datfab.nComp() >= NUM_SPECIES+1);
    AMREX_ASSERT(ncomp == 1);

    if (!PeleLM::mixture_fraction_ready) amrex::Abort("Mixture fraction not initialized");

    auto const density   = datfab.array(0);
    auto const rhoY      = datfab.array(1);
    auto       mixt_frac = derfab.array(0);

    // TODO probably better way to do this ?
    amrex::Real Zox_lcl   = PeleLM::Zox;
    amrex::Real Zfu_lcl   = PeleLM::Zfu;
    amrex::Real denom_inv = 1.0 / (Zfu_lcl - Zox_lcl);
    amrex::GpuArray<amrex::Real,NUM_SPECIES> fact_lcl;
    for (int n=0; n<NUM_SPECIES; ++n) {
        fact_lcl[n] = PeleLM::spec_Bilger_fact[n];
    }

    amrex::ParallelFor(bx,
    [density, rhoY, mixt_frac, fact_lcl, Zox_lcl, denom_inv] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
    {
        calcMixtFrac(i,j,k,
                     Zox_lcl, denom_inv, fact_lcl.data(),
                     density, rhoY, mixt_frac);
    });
}